

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O0

void __thiscall Else::gen(Else *this,int b,int a)

{
  element_type *peVar1;
  element_type *peVar2;
  ostream *this_00;
  string local_1d8;
  uint local_1b8;
  int label2;
  uint local_1a4;
  stringstream local_1a0 [4];
  int label1;
  stringstream ss;
  ostream local_190 [376];
  uint local_18;
  int local_14;
  int a_local;
  int b_local;
  Else *this_local;
  
  local_18 = a;
  local_14 = b;
  _a_local = this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1a4 = Node::newlabel((Node *)this);
  local_1b8 = Node::newlabel((Node *)this);
  peVar1 = std::__shared_ptr_access<Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->expr);
  (*(peVar1->super_Node)._vptr_Node[4])(peVar1,0,(ulong)local_1b8);
  Node::emitlabel((Node *)this,local_1a4);
  peVar2 = std::__shared_ptr_access<Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->stmt1);
  (*(peVar2->super_Node)._vptr_Node[2])(peVar2,(ulong)local_1a4,(ulong)local_18);
  this_00 = std::operator<<(local_190,"goto L");
  std::ostream::operator<<(this_00,local_18);
  std::__cxx11::stringstream::str();
  Node::emit((Node *)this,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  Node::emitlabel((Node *)this,local_1b8);
  peVar2 = std::__shared_ptr_access<Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->stmt2);
  (*(peVar2->super_Node)._vptr_Node[2])(peVar2,(ulong)local_1b8,(ulong)local_18);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void gen(int b, int a) override {
		std::stringstream ss;
		int label1 = newlabel();
		int label2 = newlabel();
		expr->jumping(0, label2);
		emitlabel(label1);
		stmt1->gen(label1, a);
		ss << "goto L" << a;
		emit(ss.str());
		emitlabel(label2);
		stmt2->gen(label2, a);
	}